

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  sources;
  
  puts("===FAIL===\n");
  sources.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sources.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sources.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  populate_sources("test/fail%d.json",&sources);
  lVar5 = 1;
  lVar4 = 0;
  uVar3 = 0;
  while( true ) {
    uVar2 = ((long)sources.
                   super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)sources.
                  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x18;
    if (uVar2 <= lVar5 - 1U) break;
    printf("Parsing %zd\n",lVar5,
           ((long)sources.
                  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)sources.
                 super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) % 0x18);
    bVar1 = parse(*(char **)((long)&((sources.
                                      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                    super__Vector_impl_data._M_start + lVar4));
    uVar3 = uVar3 + bVar1;
    lVar4 = lVar4 + 0x18;
    lVar5 = lVar5 + 1;
  }
  printf("Passed %d from %zd tests\n",(ulong)uVar3,uVar2);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::clear(&sources);
  puts("\n===PASS===\n");
  populate_sources("test/pass%d.json",&sources);
  lVar5 = 1;
  lVar4 = 0;
  uVar3 = 0;
  while( true ) {
    uVar2 = ((long)sources.
                   super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)sources.
                  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x18;
    if (uVar2 <= lVar5 - 1U) break;
    printf("Parsing %zd\n",lVar5,
           ((long)sources.
                  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)sources.
                 super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) % 0x18);
    bVar1 = parse(*(char **)((long)&((sources.
                                      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                    super__Vector_impl_data._M_start + lVar4));
    uVar3 = uVar3 + bVar1;
    lVar4 = lVar4 + 0x18;
    lVar5 = lVar5 + 1;
  }
  printf("Passed %d from %zd tests\n",(ulong)uVar3,uVar2);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::~vector(&sources);
  return 0;
}

Assistant:

int main()
{
	// Fail
	printf("===FAIL===\n\n");
	std::vector<std::vector<char> > sources;
	populate_sources("test/fail%d.json", sources);
	int passed = 0;
	for (size_t i = 0; i < sources.size(); ++i)
	{
		printf("Parsing %zd\n", i + 1);
		if (parse(&sources[i][0]))
		{
			++passed;
		}
	}
	printf("Passed %d from %zd tests\n", passed, sources.size());

	// Pass
	sources.clear();
	printf("\n===PASS===\n\n");
	populate_sources("test/pass%d.json", sources);
	passed = 0;
	for (size_t i = 0; i < sources.size(); ++i)
	{
		printf("Parsing %zd\n", i + 1);
		if (parse(&sources[i][0]))
		{
			++passed;
		}
	}
	printf("Passed %d from %zd tests\n", passed, sources.size());

	return 0;
}